

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu34x.c
# Opt level: O1

MPP_RET hal_vp9d_vdpu34x_deinit(void *hal)

{
  long lVar1;
  MppBuffer buffer;
  MPP_RET MVar2;
  char *fmt;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if ((*(MppBuffer *)(lVar1 + 0xe0) == (MppBuffer)0x0) ||
     (MVar2 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0xe0),"hal_vp9d_release_res"),
     MVar2 == MPP_OK)) {
    lVar5 = 0;
    do {
      buffer = *(MppBuffer *)(lVar1 + 0x218 + lVar5 * 8);
      if ((buffer != (MppBuffer)0x0) &&
         (MVar2 = mpp_buffer_put_with_caller(buffer,"hal_vp9d_release_res"), MVar2 != MPP_OK))
      goto LAB_002064e0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (*(int *)((long)hal + 0x38) == 0) {
      if ((*(MppBuffer *)(lVar1 + 0xc0) == (MppBuffer)0x0) ||
         (MVar2 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0xc0),"hal_vp9d_release_res"),
         MVar2 == MPP_OK)) {
        if (*(void **)(lVar1 + 0xe8) != (void *)0x0) {
          mpp_osal_free("hal_vp9d_release_res",*(void **)(lVar1 + 0xe8));
          *(undefined8 *)(lVar1 + 0xe8) = 0;
        }
        if ((*(MppBuffer *)(lVar1 + 0x1e8) == (MppBuffer)0x0) ||
           (MVar2 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x1e8),"hal_vp9d_release_res")
           , MVar2 == MPP_OK)) goto LAB_002065b3;
        fmt = "vp9 rcb_buf put buffer failed\n";
      }
      else {
LAB_002064e0:
        fmt = "vp9 probe_base put buffer failed\n";
      }
    }
    else {
      puVar3 = (undefined8 *)(lVar1 + 0x38);
      uVar4 = 0;
      do {
        if (((MppBuffer)puVar3[-5] != (MppBuffer)0x0) &&
           (MVar2 = mpp_buffer_put_with_caller((MppBuffer)puVar3[-5],"hal_vp9d_release_res"),
           MVar2 != MPP_OK)) goto LAB_002064e0;
        if ((void *)puVar3[-1] != (void *)0x0) {
          mpp_osal_free("hal_vp9d_release_res",(void *)puVar3[-1]);
          puVar3[-1] = 0;
        }
        if (((MppBuffer)*puVar3 != (MppBuffer)0x0) &&
           (MVar2 = mpp_buffer_put_with_caller((MppBuffer)*puVar3,"hal_vp9d_release_res"),
           MVar2 != MPP_OK)) {
          _mpp_log_l(2,"hal_vp9d_vdpu34x","vp9 rcb_buf[%d] put buffer failed\n",(char *)0x0,
                     uVar4 & 0xffffffff);
          goto LAB_002064fc;
        }
        uVar4 = uVar4 + 1;
        puVar3 = puVar3 + 8;
      } while (uVar4 != 3);
LAB_002065b3:
      if ((*(HalBufs *)(lVar1 + 0x1f8) == (HalBufs)0x0) ||
         (MVar2 = hal_bufs_deinit(*(HalBufs *)(lVar1 + 0x1f8)), MVar2 == MPP_OK)) {
        if ((*(MppBuffer *)(lVar1 + 200) == (MppBuffer)0x0) ||
           (MVar2 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 200),"hal_vp9d_release_res"),
           MVar2 == MPP_OK)) goto LAB_002064fc;
        fmt = "vp9 seg_base put buffer failed\n";
      }
      else {
        fmt = "vp9 cmv bufs deinit buffer failed\n";
      }
    }
  }
  else {
    fmt = "vp9 probe_wr_base put buffer failed\n";
  }
  _mpp_log_l(2,"hal_vp9d_vdpu34x",fmt,(char *)0x0);
LAB_002064fc:
  if ((*(MppBufferGroup *)((long)hal + 0x28) == (MppBufferGroup)0x0) ||
     (MVar2 = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x28)), MVar2 == MPP_OK)) {
    if (*(void **)((long)hal + 0x40) != (void *)0x0) {
      mpp_osal_free("hal_vp9d_vdpu34x_deinit",*(void **)((long)hal + 0x40));
    }
    *(undefined8 *)((long)hal + 0x40) = 0;
    MVar2 = MPP_OK;
  }
  else {
    _mpp_log_l(2,"hal_vp9d_vdpu34x","vp9d group free buffer failed\n",(char *)0x0);
  }
  return MVar2;
}

Assistant:

static MPP_RET hal_vp9d_vdpu34x_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx *)hal;

    hal_vp9d_release_res(p_hal);

    if (p_hal->group) {
        ret = mpp_buffer_group_put(p_hal->group);
        if (ret) {
            mpp_err("vp9d group free buffer failed\n");
            return ret;
        }
    }
    MPP_FREE(p_hal->hw_ctx);
    return ret = MPP_OK;
}